

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

double __thiscall ON_MorphControl::Weight(ON_MorphControl *this,ON_3dex ijk)

{
  int iVar1;
  int k;
  double local_58;
  double local_50;
  double local_38;
  double w;
  ON_MorphControl *this_local;
  int local_18;
  int iStack_14;
  ON_3dex ijk_local;
  
  k = ijk.k;
  local_38 = 1.0;
  iVar1 = this->m_varient;
  local_18 = ijk.i;
  iStack_14 = ijk.j;
  if (iVar1 == 1) {
    if ((iStack_14 == 0) && (k == 0)) {
      local_50 = ON_NurbsCurve::Weight(&this->m_nurbs_curve,local_18);
    }
    else {
      local_50 = 1.0;
    }
    local_38 = local_50;
  }
  else if (iVar1 == 2) {
    if (k == 0) {
      local_58 = ON_NurbsSurface::Weight(&this->m_nurbs_surface,local_18,iStack_14);
    }
    else {
      local_58 = 1.0;
    }
    local_38 = local_58;
  }
  else if (iVar1 == 3) {
    local_38 = ON_NurbsCage::Weight(&this->m_nurbs_cage,local_18,iStack_14,k);
  }
  return local_38;
}

Assistant:

double ON_MorphControl::Weight(ON_3dex ijk) const
{
  double w = 1.0;

  switch(m_varient)
  {
  case 1:
    w = (0 == ijk.j && 0 == ijk.k) ? m_nurbs_curve.Weight(ijk.i) : 1.0;
    break;
  case 2:
    w = (0 == ijk.k) ? m_nurbs_surface.Weight(ijk.i,ijk.j) : 1.0;
    break;
  case 3:
    w = m_nurbs_cage.Weight(ijk.i,ijk.j,ijk.k);
    break;
  }

  return w;
}